

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

Status __thiscall
wallet::BerkeleyROCursor::Next(BerkeleyROCursor *this,DataStream *ssKey,DataStream *ssValue)

{
  long lVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  Status SVar4;
  _Base_ptr __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = (this->m_cursor)._M_node;
  if (__n == (this->m_cursor_end)._M_node) {
    SVar4 = DONE;
  }
  else {
    DataStream::write(ssKey,(int)*(long *)(__n + 1),
                      (void *)((long)__n[1]._M_parent - *(long *)(__n + 1)),(size_t)__n);
    p_Var2 = (this->m_cursor)._M_node;
    p_Var3 = p_Var2[1]._M_right;
    DataStream::write(ssValue,(int)p_Var3,(void *)(*(long *)(p_Var2 + 2) - (long)p_Var3),(size_t)__n
                     );
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
    ::operator++(&this->m_cursor,0);
    SVar4 = MORE;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar4;
  }
  __stack_chk_fail();
}

Assistant:

DatabaseCursor::Status BerkeleyROCursor::Next(DataStream& ssKey, DataStream& ssValue)
{
    if (m_cursor == m_cursor_end) {
        return DatabaseCursor::Status::DONE;
    }
    ssKey.write(Span(m_cursor->first));
    ssValue.write(Span(m_cursor->second));
    m_cursor++;
    return DatabaseCursor::Status::MORE;
}